

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void ForEachOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  undefined1 local_b0 [8];
  OptionDesc d;
  TidyOption topt;
  TidyIterator pos;
  OptionFunc OptionPrint_local;
  TidyDoc tdoc_local;
  
  pos = (TidyIterator)OptionPrint;
  OptionPrint_local = (OptionFunc)tdoc;
  topt = (TidyOption)tidyGetOptionList(tdoc);
  while (topt != (TidyOption)0x0) {
    d._128_8_ = tidyGetNextOption((TidyDoc)OptionPrint_local,(TidyIterator *)&topt);
    GetOption((TidyDoc)OptionPrint_local,(TidyOption)d._128_8_,(OptionDesc *)local_b0);
    (*(code *)pos)(OptionPrint_local,d._128_8_,local_b0);
  }
  return;
}

Assistant:

static void ForEachOption(TidyDoc tdoc,          /**< The Tidy document. */
                          OptionFunc OptionPrint /**< The printing function to be used. */
)
{
    TidyIterator pos = tidyGetOptionList( tdoc );

    while ( pos )
    {
        TidyOption topt = tidyGetNextOption( tdoc, &pos );
        OptionDesc d;

        GetOption( tdoc, topt, &d );
        (*OptionPrint)( tdoc, topt, &d );
    }
}